

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

void __thiscall Symbol::Symbol(Symbol *this,u8 *begin,u8 *end)

{
  ulong uVar1;
  uint uVar2;
  
  (this->val).num = 0;
  uVar2 = (uint)((long)end - (long)begin);
  if (((long)end - (long)begin & 0xfffffff8U) == 0) {
    switchD_00916250::default(this,begin,(ulong)(uVar2 & 7));
    uVar1 = (ulong)(uVar2 * 0xffffff8 + 0x2000040);
  }
  else {
    (this->val).num = *(u64 *)begin;
    uVar1 = 0x82000000;
  }
  this->icl = uVar1;
  return;
}

Assistant:

explicit Symbol(const char* input, u32 len) {
      val.num = 0;
      if (len>=8) {
          len = 8;
          memcpy(val.str, input, 8);
      } else {
          memcpy(val.str, input, len);
      }
      set_code_len(FSST_CODE_MAX, len);
   }